

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O1

ErrorCode __thiscall
ComponentManager::GetService(ComponentManager *this,CID cid,IID iid,void **object)

{
  Node *pNVar1;
  uint in_EAX;
  int iVar2;
  undefined4 extraout_var;
  ClassInfo *pCVar3;
  Node *pNVar4;
  ErrorCode result;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  pNVar4 = (this->mClasses).mHead;
  pNVar1 = (this->mClasses).mTail;
  do {
    pNVar4 = pNVar4->next;
    if (pNVar4 == pNVar1) {
      pCVar3 = (ClassInfo *)0x0;
      break;
    }
    pCVar3 = pNVar4->val;
    iVar2 = strcmp((pCVar3->mCid).mId,cid.mId);
  } while (iVar2 != 0);
  if (pCVar3 == (ClassInfo *)0x0) {
    uStack_38 = 0x200000000;
  }
  else {
    iVar2 = (*pCVar3->mClass->_vptr_ISupports[2])(pCVar3->mClass,iid.mId,(long)&uStack_38 + 4);
    *object = (void *)CONCAT44(extraout_var,iVar2);
  }
  return uStack_38._4_4_;
}

Assistant:

ErrorCode ComponentManager::GetService( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;
	ClassInfo match( cid );

	ClassInfo *info = NULL;

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			info = *i;
			break;
		}
	}
	
	LOG( "info is %p", info );
	
	if ( info != NULL )
		*object = info->mClass->QueryInterface( iid, &result );
	else
		result = kNoClass;

	return result;
}